

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorLuminancePicker::setCol(QColorLuminancePicker *this,int h,int s)

{
  setCol(this,h,s,this->val);
  newHsv(this,h,s,this->val);
  return;
}

Assistant:

void QColorLuminancePicker::setCol(int h, int s)
{
    setCol(h, s, val);
    emit newHsv(h, s, val);
}